

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

int main(void)

{
  exception *e;
  string local_68 [8];
  string to;
  string local_30 [8];
  string from;
  
  prompt_filename_abi_cxx11_((FileType *)local_30);
  prompt_filename_abi_cxx11_((FileType *)local_68);
  reverse_chars(local_30,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto from = prompt_filename(FileType::in);
		auto to = prompt_filename(FileType::out);
		reverse_chars(from, to);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}